

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Edg_ManAssignEdgeNew(Gia_Man_t *p,int nEdges,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int Level;
  int iObj;
  int iLast;
  int i;
  int j;
  int k;
  int DelayPrev;
  int DelayR;
  int DelayD;
  Vec_Int_t *vEdge2;
  Vec_Int_t *vEdge1;
  Vec_Wec_t *vEdges;
  Vec_Int_t *vLevel;
  int fLevelVerbose;
  int DelayNoEdge;
  int fVerbose_local;
  int nEdges_local;
  Gia_Man_t *p_local;
  
  vLevel._4_4_ = 1;
  vLevel._0_4_ = 0;
  fLevelVerbose = fVerbose;
  DelayNoEdge = nEdges;
  _fVerbose_local = p;
  vEdge1 = (Vec_Int_t *)Vec_WecStart(0);
  vEdge2 = (Vec_Int_t *)0x0;
  _DelayR = (Vec_Int_t *)0x0;
  DelayPrev = 0;
  j = 1000000000;
  Level = -1;
  if (fLevelVerbose != 0) {
    printf("Running edge assignment with E = %d.\n",(ulong)(uint)DelayNoEdge);
  }
  Edg_ManToMapping(_fVerbose_local);
  Vec_IntFreeP(&_fVerbose_local->vEdge1);
  Vec_IntFreeP(&_fVerbose_local->vEdge2);
  iVar1 = Gia_ManObjNum(_fVerbose_local);
  pVVar3 = Vec_IntStart(iVar1);
  _fVerbose_local->vEdge1 = pVVar3;
  iVar1 = Gia_ManObjNum(_fVerbose_local);
  pVVar3 = Vec_IntStart(iVar1);
  _fVerbose_local->vEdge2 = pVVar3;
  for (iObj = 0; (iObj < 10000 && (iObj <= Level + 0x32)); iObj = iObj + 1) {
    DelayPrev = Edg_ManEvalEdgeDelay(_fVerbose_local);
    iVar1 = Edg_ManEvalEdgeDelayR(_fVerbose_local);
    if (DelayPrev != iVar1 + vLevel._4_4_) {
      __assert_fail("DelayD == DelayR + DelayNoEdge",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x3b2,"int Edg_ManAssignEdgeNew(Gia_Man_t *, int, int)");
    }
    if (DelayPrev < j) {
      Vec_IntFreeP(&vEdge2);
      vEdge2 = Vec_IntDup(_fVerbose_local->vEdge1);
      Vec_IntFreeP((Vec_Int_t **)&DelayR);
      _DelayR = Vec_IntDup(_fVerbose_local->vEdge2);
      Level = iObj;
      j = DelayPrev;
    }
    if (fLevelVerbose != 0) {
      printf("\nIter %4d : Delay = %4d\n",(ulong)(uint)iObj,(ulong)(uint)DelayPrev);
    }
    Edg_ManCollectCritEdges(_fVerbose_local,(Vec_Wec_t *)vEdge1,DelayPrev);
    if ((int)vLevel != 0) {
      for (i = 0; iVar1 = Vec_WecSize((Vec_Wec_t *)vEdge1), i < iVar1; i = i + 1) {
        vEdges = (Vec_Wec_t *)Vec_WecEntry((Vec_Wec_t *)vEdge1,i);
        Vec_IntPush((Vec_Int_t *)vEdges,i);
      }
    }
    Vec_WecSort((Vec_Wec_t *)vEdge1,0);
    if ((int)vLevel != 0) {
      for (i = 0; iVar1 = Vec_WecSize((Vec_Wec_t *)vEdge1), i < iVar1; i = i + 1) {
        vEdges = (Vec_Wec_t *)Vec_WecEntry((Vec_Wec_t *)vEdge1,i);
        uVar2 = Vec_IntPop((Vec_Int_t *)vEdges);
        printf("%d: Level %2d : ",(ulong)(uint)i,(ulong)uVar2);
        Vec_IntPrint((Vec_Int_t *)vEdges);
      }
    }
    for (i = 0; iVar1 = Vec_WecSize((Vec_Wec_t *)vEdge1), i < iVar1; i = i + 1) {
      vEdges = (Vec_Wec_t *)Vec_WecEntry((Vec_Wec_t *)vEdge1,i);
      for (iLast = 0; iVar1 = Vec_IntSize((Vec_Int_t *)vEdges), iLast < iVar1; iLast = iLast + 1) {
        iVar1 = Vec_IntEntry((Vec_Int_t *)vEdges,iLast);
        iVar1 = Edg_ObjImprove(_fVerbose_local,iVar1,DelayNoEdge,DelayPrev,fLevelVerbose);
        if (iVar1 != 0) break;
      }
      iVar1 = Vec_IntSize((Vec_Int_t *)vEdges);
      if (iLast < iVar1) break;
    }
    iVar1 = Vec_WecSize((Vec_Wec_t *)vEdge1);
    if (i == iVar1) break;
  }
  Vec_WecFree((Vec_Wec_t *)vEdge1);
  Vec_IntFreeP(&_fVerbose_local->vEdge1);
  _fVerbose_local->vEdge1 = vEdge2;
  Vec_IntFreeP(&_fVerbose_local->vEdge2);
  _fVerbose_local->vEdge2 = _DelayR;
  return DelayPrev;
}

Assistant:

int Edg_ManAssignEdgeNew( Gia_Man_t * p, int nEdges, int fVerbose )
{
    int DelayNoEdge = 1;
    int fLevelVerbose = 0;
    Vec_Int_t * vLevel;
    Vec_Wec_t * vEdges = Vec_WecStart(0);
    Vec_Int_t * vEdge1 = NULL, * vEdge2 = NULL;
    int DelayD = 0, DelayR = 0, DelayPrev = ABC_INFINITY;
    int k, j, i, iLast = -1, iObj;
    if ( fVerbose )
        printf( "Running edge assignment with E = %d.\n", nEdges );
    // create fanouts
    Edg_ManToMapping( p );
    // create empty assignment
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    // perform optimization
    for ( i = 0; i < 10000; i++ )
    {
        // if there is no improvement after 10 iterations, quit
        if ( i > iLast + 50 )
            break;
        // create delay information
        DelayD = Edg_ManEvalEdgeDelay( p );
        DelayR = Edg_ManEvalEdgeDelayR( p );
        assert( DelayD == DelayR + DelayNoEdge );
        if ( DelayPrev > DelayD )
        {
            //printf( "Saving backup point at %d levels.\n", DelayD );
            Vec_IntFreeP( &vEdge1 );  vEdge1 = Vec_IntDup( p->vEdge1 );
            Vec_IntFreeP( &vEdge2 );  vEdge2 = Vec_IntDup( p->vEdge2 );
            DelayPrev = DelayD;
            iLast = i;
        }
        if ( fVerbose )
            printf( "\nIter %4d : Delay = %4d\n", i, DelayD );
        // collect critical nodes (nodes with critical edges)
        Edg_ManCollectCritEdges( p, vEdges, DelayD );
        // sort levels according to the number of critical edges
        if ( fLevelVerbose )
        {
            Vec_WecForEachLevel( vEdges, vLevel, k )
                Vec_IntPush( vLevel, k );
        }
        Vec_WecSort( vEdges, 0 );
        if ( fLevelVerbose )
        {
            Vec_WecForEachLevel( vEdges, vLevel, k )
            {
                int Level = Vec_IntPop( vLevel );
                printf( "%d: Level %2d : ", k, Level );
                Vec_IntPrint( vLevel );
            }
        }
        Vec_WecForEachLevel( vEdges, vLevel, k )
        {
            Vec_IntForEachEntry( vLevel, iObj, j )
                if ( Edg_ObjImprove(p, iObj, nEdges, DelayD, fVerbose) ) // improved
                    break;
            if ( j < Vec_IntSize(vLevel) )
                break;
        }
        if ( k == Vec_WecSize(vEdges) ) // if we could not improve anything, quit
            break;
    }
    Vec_WecFree( vEdges );
    // update to the saved version
    Vec_IntFreeP( &p->vEdge1 );  p->vEdge1 = vEdge1;
    Vec_IntFreeP( &p->vEdge2 );  p->vEdge2 = vEdge2;
    return DelayD;
}